

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHolder.hpp
# Opt level: O2

void __thiscall OpenMD::DataHolder::validate(DataHolder *this)

{
  _Rb_tree_node_base *p_Var1;
  ostream *poVar2;
  OpenMDException *this_00;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  p_Var1 = (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var1 == &(this->parameters_)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    if ((*(char *)(*(long *)(p_Var1 + 2) + 0x28) == '\0') &&
       (*(char *)(*(long *)(p_Var1 + 2) + 0x2a) == '\x01')) break;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_190,(string *)(*(long *)(p_Var1 + 2) + 8));
  std::operator<<(poVar2," must be set.\n");
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&local_1c0);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

virtual void validate() {
      ParamMap::iterator i;
      for (i = parameters_.begin(); i != parameters_.end(); ++i) {
        if (!i->second->isOptional() && i->second->empty()) {
          std::stringstream ss;
          ss << i->second->getKeyword() << " must be set.\n";
          throw OpenMDException(ss.str());
        }
      }
    }